

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

void __thiscall IZDeflate::bi_init(IZDeflate *this,char *tgt_buf,uint tgt_size,int flsh_allowed)

{
  init_desc(this);
  this->out_buf = tgt_buf;
  this->out_size = tgt_size;
  this->out_offset = 0;
  this->flush_flg = flsh_allowed;
  this->bi_buf = 0;
  this->bi_valid = 0;
  return;
}

Assistant:

void IZDeflate::bi_init (char *tgt_buf, unsigned tgt_size, int flsh_allowed)
    // char *tgt_buf;
    // unsigned tgt_size;
    // int flsh_allowed;
{
   init_desc();

    out_buf = tgt_buf;
    out_size = tgt_size;
    out_offset = 0;
    flush_flg = flsh_allowed;

    bi_buf = 0;
    bi_valid = 0;
#ifdef DEBUG
    bits_sent = (uzoff_t)0;
#endif
}